

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::emit_marker(jpeg_encoder *this,int marker)

{
  char cVar1;
  undefined1 uVar2;
  undefined1 local_12;
  undefined1 local_11;
  int iVar3;
  
  if (this->m_all_stream_writes_succeeded == true) {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_12,1);
    cVar1 = (char)iVar3;
  }
  else {
    cVar1 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)cVar1;
  if ((bool)cVar1 == false) {
    uVar2 = false;
  }
  else {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_11,1);
    uVar2 = (undefined1)iVar3;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar2;
  return;
}

Assistant:

void jpeg_encoder::emit_marker(int marker)
{
  emit_byte(uint8(0xFF)); emit_byte(uint8(marker));
}